

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_two_connections.cpp
# Opt level: O3

void __thiscall
TwoConnections_CommitToFirstConnectionDoesNotAffectFooterPosForSecond_Test::
~TwoConnections_CommitToFirstConnectionDoesNotAffectFooterPosForSecond_Test
          (TwoConnections_CommitToFirstConnectionDoesNotAffectFooterPosForSecond_Test *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  
  (this->super_TwoConnections).super_Test._vptr_Test = (_func_int **)&PTR__TwoConnections_00271b00;
  pstore::database::~database(&(this->super_TwoConnections).second);
  pstore::database::~database(&(this->super_TwoConnections).first);
  p_Var1 = (this->super_TwoConnections).file.file_.
           super___shared_ptr<pstore::file::in_memory,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  p_Var1 = (this->super_TwoConnections).file.buffer_.
           super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x270);
  return;
}

Assistant:

TEST_F (TwoConnections, CommitToFirstConnectionDoesNotAffectFooterPosForSecond) {
    ASSERT_EQ (pstore::leader_size, second.footer_pos ().absolute ());
    {
        auto transaction = pstore::begin (first);
        append_int (transaction, 1);
        transaction.commit ();
    }
    EXPECT_GE (first.footer_pos ().absolute (),
               pstore::leader_size + sizeof (int) + sizeof (pstore::trailer));
    EXPECT_EQ (second.footer_pos ().absolute (), pstore::leader_size);
}